

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPlatform.c
# Opt level: O3

char xplt_getch(void)

{
  int iVar1;
  
  system("/bin/stty raw");
  do {
    iVar1 = getchar();
  } while ((char)iVar1 == '\0');
  system("/bin/stty cooked");
  return (char)iVar1;
}

Assistant:

char xplt_getch() {
    char c = 0;
    system("/bin/stty raw");
    while (c == 0) {
        c = getchar();
    }
    system("/bin/stty cooked");
    return c;
}